

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O0

void __thiscall DFsScript::ParseInclude(DFsScript *this,char *lumpname)

{
  int lump_00;
  char *datap;
  undefined1 local_c90 [8];
  FParser parse;
  int lumplen;
  char *lump;
  int lumpnum;
  char *lumpname_local;
  DFsScript *this_local;
  
  lump_00 = FWadCollection::CheckNumForName(&Wads,lumpname);
  if (lump_00 == -1) {
    I_Error("include lump \'%s\' not found!\n",lumpname);
  }
  else {
    parse.t_func.Chars._4_4_ = FWadCollection::LumpLength(&Wads,lump_00);
    datap = (char *)operator_new__((long)(parse.t_func.Chars._4_4_ + 10));
    FWadCollection::ReadLump(&Wads,lump_00,datap);
    datap[parse.t_func.Chars._4_4_] = '\0';
    ProcessFindChar(this,datap,'\0');
    FParser::FParser((FParser *)local_c90,this);
    FParser::Run((FParser *)local_c90,datap,datap,datap + parse.t_func.Chars._4_4_);
    if (datap != (char *)0x0) {
      operator_delete__(datap);
    }
    FParser::~FParser((FParser *)local_c90);
  }
  return;
}

Assistant:

void DFsScript::ParseInclude(char *lumpname)
{
	int lumpnum;
	char *lump;
	
	if((lumpnum = Wads.CheckNumForName(lumpname)) == -1)
    {
		I_Error("include lump '%s' not found!\n", lumpname);
		return;
    }
	
	int lumplen=Wads.LumpLength(lumpnum);
	lump=new char[lumplen+10];
	Wads.ReadLump(lumpnum,lump);
	
	lump[lumplen]=0;
	
	// preprocess the include
	// we assume that it does not include sections or labels or 
	// other nasty things
	ProcessFindChar(lump, 0);
	
	// now parse the lump
	FParser parse(this);
	parse.Run(lump, lump, lump+lumplen);
	
	// free the lump
	delete[] lump;
}